

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

node_t_conflict new_node(c2m_ctx_t c2m_ctx,node_code_t nc)

{
  uint uVar1;
  node_t_conflict n;
  
  n = (node_t_conflict)reg_malloc(c2m_ctx,0x30);
  n->code = nc;
  uVar1 = c2m_ctx->curr_uid;
  c2m_ctx->curr_uid = uVar1 + 1;
  n->uid = uVar1;
  (n->u).s.s = (char *)0x0;
  (n->u).s.len = 0;
  n->attr = (void *)0x0;
  set_node_pos(c2m_ctx,n,(pos_t)(ZEXT816(0xffffffffffffffff) << 0x40));
  return n;
}

Assistant:

static node_t new_node (c2m_ctx_t c2m_ctx, node_code_t nc) {
  node_t n = reg_malloc (c2m_ctx, sizeof (struct node));

  n->code = nc;
  n->uid = curr_uid++;
  DLIST_INIT (node_t, n->u.ops);
  n->attr = NULL;
  set_node_pos (c2m_ctx, n, no_pos);
  return n;
}